

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

fxp_xfer * xfer_upload_init(fxp_handle *fh,uint64_t offset)

{
  fxp_xfer *pfVar1;
  
  pfVar1 = (fxp_xfer *)safemalloc(1,0x40,0);
  pfVar1->fh = fh;
  pfVar1->offset = offset;
  pfVar1->req_totalsize = 0;
  pfVar1->req_maxsize = 0x100000;
  pfVar1->head = (req *)0x0;
  pfVar1->tail = (req *)0x0;
  pfVar1->filesize = 0xffffffffffffffff;
  pfVar1->furthestdata = 0;
  pfVar1->eof = true;
  pfVar1->err = false;
  return pfVar1;
}

Assistant:

struct fxp_xfer *xfer_upload_init(struct fxp_handle *fh, uint64_t offset)
{
    struct fxp_xfer *xfer = xfer_init(fh, offset);

    /*
     * We set `eof' to 1 because this will cause xfer_done() to
     * return true iff there are no outstanding requests. During an
     * upload, our caller will be responsible for working out
     * whether all the data has been sent, so all it needs to know
     * from us is whether the outstanding requests have been
     * handled once that's done.
     */
    xfer->eof = true;

    return xfer;
}